

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

void idx2::RemoveDir(cstr Path)

{
  int iVar1;
  size_t sVar2;
  cstr __name;
  DIR *__dirp;
  dirent *pdVar3;
  DIR *__dirp_00;
  FILE *__stream;
  char AbsPath [257];
  anon_union_8_2_2df48d06_for_stref_0 local_138;
  undefined4 local_130;
  
  local_138.ConstPtr = Path;
  sVar2 = strlen(Path);
  local_130 = (undefined4)sVar2;
  __name = ToString((stref *)&local_138);
  iVar1 = access(__name,0);
  if (iVar1 == 0) {
    __dirp = opendir(Path);
    memset(&local_138,0,0x101);
    pdVar3 = readdir(__dirp);
    while (pdVar3 != (dirent *)0x0) {
      if (pdVar3->d_name[0] != '.') {
        sprintf((char *)&local_138,"%s/%s",Path,pdVar3->d_name);
        __dirp_00 = opendir((char *)&local_138);
        if (__dirp_00 == (DIR *)0x0) {
          __stream = fopen((char *)&local_138,"r");
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
            remove((char *)&local_138);
          }
        }
        else {
          closedir(__dirp_00);
          RemoveDir((cstr)&local_138);
        }
      }
      pdVar3 = readdir(__dirp);
    }
    remove(Path);
  }
  return;
}

Assistant:

void
RemoveDir(cstr Path)
{
  if (!DirExists(Path))
    return;

  struct dirent* Entry = nullptr;
  DIR* Dir = nullptr;
  Dir = opendir(Path);
  char AbsPath[257] = { 0 };

  while (Entry = readdir(Dir))
  {
    if (*(Entry->d_name) == '.')
      continue;

    DIR* SubDir = nullptr;
    FILE* File = nullptr;
    sprintf(AbsPath, "%s/%s", Path, Entry->d_name);
    if (SubDir = opendir(AbsPath))
    {
      closedir(SubDir);
      RemoveDir(AbsPath);
    }
    else if (File = fopen(AbsPath, "r"))
    {
      fclose(File);
      remove(AbsPath);
    }
  }

  remove(Path);
}